

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

TPZCompEl * __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>::Element
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid> *this,int64_t elindex)

{
  return (this->fElementVec).super_TPZVec<TPZCompElSide>.fStore[elindex].fEl;
}

Assistant:

T& operator[]( const int64_t index ) const
	{
#ifdef PZDEBUG
		if( index < 0 || index >= fNElements )
		{
            PZError << __PRETTY_FUNCTION__ << " acessing element out of range.";
            PZError << "|" << std::endl;
            PZError << "+-> NElements = " << NElements() << std::endl;
            PZError << "|" << std::endl;
            PZError << "+-> Index = " << index << std::endl;
            DebugStop();
            exit( -1 );
		}
#endif
		return fStore[ index ];
	}